

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

Point * __thiscall tiger::trains::world::World::getPointOfPost(World *this,IPost *post)

{
  map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  *this_00;
  pointer ppVar1;
  long *in_RSI;
  long in_RDI;
  
  this_00 = (map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
             *)(in_RDI + 0x2a0);
  (**(code **)(*in_RSI + 0x20))();
  std::
  map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::find(this_00,(key_type *)0x2244da);
  ppVar1 = std::_Rb_tree_const_iterator<std::pair<const_int,_tiger::trains::world::Point_*>_>::
           operator->((_Rb_tree_const_iterator<std::pair<const_int,_tiger::trains::world::Point_*>_>
                       *)0x2244e9);
  return ppVar1->second;
}

Assistant:

Point *World::getPointOfPost(const IPost *post) const
{
    return pointOfPost.find(post->getIdx())->second;
}